

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

void __thiscall DSDcc::DSDDstar::processSlowData(DSDDstar *this,bool firstFrame)

{
  DStarSlowDataType DVar1;
  byte in_SIL;
  DSDDstar *in_RDI;
  DSDDstar *unaff_retaddr;
  int dataType;
  undefined4 in_stack_ffffffffffffffe0;
  DStarSlowDataType in_stack_ffffffffffffffe4;
  
  if (((in_SIL & 1) == 0) && ((in_RDI->m_slowData).counter != 0)) {
    if (0 < (in_RDI->m_slowData).counter) {
      processSlowDataByte(in_RDI,in_RDI->slowdata[0]);
      (in_RDI->m_slowData).counter = (in_RDI->m_slowData).counter + -1;
    }
  }
  else {
    DVar1 = (int)(uint)in_RDI->slowdata[0] >> 4;
    (in_RDI->m_slowData).counter = in_RDI->slowdata[0] & 0xf;
    if (DVar1 < DStarSlowDataNone) {
      if (DVar1 == DStarSlowDataFiller) {
        (in_RDI->m_slowData).currentDataType = DStarSlowDataFiller;
        (in_RDI->m_slowData).counter = 2;
      }
      else if (DVar1 == DStarSlowDataText) {
        (in_RDI->m_slowData).textFrameIndex = (in_RDI->m_slowData).counter % 4;
        (in_RDI->m_slowData).counter = 5;
        (in_RDI->m_slowData).currentDataType = DStarSlowDataText;
      }
      else {
        (in_RDI->m_slowData).currentDataType = DVar1;
      }
    }
    else {
      (in_RDI->m_slowData).currentDataType = DStarSlowDataNone;
    }
    if ((in_SIL & 1) != 0) {
      (in_RDI->m_slowData).radioHeaderIndex = 0;
      in_stack_ffffffffffffffe4 = (in_RDI->m_slowData).currentDataType;
      if (in_stack_ffffffffffffffe4 == DStarSlowDataGPS) {
        if (((in_RDI->m_slowData).gpsStart & 1U) != 0) {
          (in_RDI->m_slowData).gpsIndex = 0;
          (in_RDI->m_slowData).gpsStart = false;
        }
      }
      else if (in_stack_ffffffffffffffe4 == DStarSlowDataText) {
        if (((in_RDI->m_slowData).gpsStart & 1U) == 0) {
          processDPRS(unaff_retaddr);
        }
        (in_RDI->m_slowData).gpsStart = true;
      }
      else if (in_stack_ffffffffffffffe4 == DStarSlowDataHeader) {
        if (((in_RDI->m_slowData).gpsStart & 1U) == 0) {
          processDPRS(unaff_retaddr);
        }
        (in_RDI->m_slowData).gpsStart = true;
      }
    }
  }
  if (0 < (in_RDI->m_slowData).counter) {
    processSlowDataByte(in_RDI,in_RDI->slowdata[1]);
    (in_RDI->m_slowData).counter = (in_RDI->m_slowData).counter + -1;
  }
  if (0 < (in_RDI->m_slowData).counter) {
    processSlowDataByte(in_RDI,in_RDI->slowdata[2]);
    (in_RDI->m_slowData).counter = (in_RDI->m_slowData).counter + -1;
  }
  processSlowDataGroup((DSDDstar *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void DSDDstar::processSlowData(bool firstFrame)
{
    // byte 0
    if (firstFrame || (m_slowData.counter == 0))
    {
        int dataType = (slowdata[0] >> 4) & 0xF;
        m_slowData.counter = slowdata[0] & 0xF;

        if (dataType > 6)
        {
            m_slowData.currentDataType = DStarSlowDataNone;
        }
        else if (dataType == 6) // filler
        {
            m_slowData.currentDataType = DStarSlowDataFiller;
            m_slowData.counter = 2;
        }
        else if (dataType == 4) // text
        {
            m_slowData.textFrameIndex = m_slowData.counter % 4;
            m_slowData.counter = 5;
            m_slowData.currentDataType = (DStarSlowDataType) dataType;
        }
        else
        {
            m_slowData.currentDataType = (DStarSlowDataType) dataType;
        }

        if (firstFrame)
        {
            // unconditionally reset counters for elements that are always contained in the same 20 frame sequence
            m_slowData.radioHeaderIndex = 0;

            // initializations based on data type
            switch (m_slowData.currentDataType)
            {
            case DStarSlowDataHeader:
                if (!m_slowData.gpsStart)
                {
                    processDPRS();
                }
                m_slowData.gpsStart = true;
                break;
            case DStarSlowDataText:
                if (!m_slowData.gpsStart)
                {
                    processDPRS();
                }
                m_slowData.gpsStart = true;
                break;
            case DStarSlowDataGPS:
                if (m_slowData.gpsStart)
                {
                    m_slowData.gpsIndex = 0;
                    m_slowData.gpsStart = false;
                }
                break;
            default:
                break;
            }
        }

//        std::cerr << "DSDDstar::processSlowData: " << dataType << ":" << m_slowData.counter << std::endl;
    }
    else
    {
        if (m_slowData.counter > 0)
        {
            processSlowDataByte(slowdata[0]);
            m_slowData.counter--;
        }
    }
    // byte 1
    if (m_slowData.counter > 0)
    {
        processSlowDataByte(slowdata[1]);
        m_slowData.counter--;
    }
    // byte 2
    if (m_slowData.counter > 0)
    {
        processSlowDataByte(slowdata[2]);
        m_slowData.counter--;
    }

    processSlowDataGroup();
}